

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

uint lyjson_parse_number(ly_ctx *ctx,char *data)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  uint local_24;
  uint len;
  char *data_local;
  ly_ctx *ctx_local;
  
  local_24 = (uint)(*data == '-');
  if (data[local_24] == '0') {
    local_24 = local_24 + 1;
  }
  else {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)data[local_24]] & 0x800) == 0) {
      ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
              "Invalid character in JSON Number value (\'%c\').",(ulong)(uint)(int)data[local_24]);
      return 0;
    }
    do {
      local_24 = local_24 + 1;
      ppuVar3 = __ctype_b_loc();
    } while (((*ppuVar3)[(int)data[local_24]] & 0x800) != 0);
  }
  if (data[local_24] == '.') {
    local_24 = local_24 + 1;
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)data[local_24]] & 0x800) == 0) {
      if (data[local_24] == '\0') {
        ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Invalid character in JSON Number value (EOF).");
      }
      else {
        ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,
                "Invalid character in JSON Number value (\'%c\').",(ulong)(uint)(int)data[local_24])
        ;
      }
      return 0;
    }
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)data[local_24]] & 0x800) != 0) {
      local_24 = local_24 + 1;
    }
  }
  if ((data[local_24] == 'e') || (data[local_24] == 'E')) {
    uVar1 = local_24 + 1;
    if ((data[uVar1] == '+') || (data[uVar1] == '-')) {
      uVar1 = local_24 + 2;
    }
    while (local_24 = uVar1, ppuVar3 = __ctype_b_loc(),
          ((*ppuVar3)[(int)data[local_24]] & 0x800) != 0) {
      uVar1 = local_24 + 1;
    }
  }
  if ((((data[local_24] == '\0') || (data[local_24] == ',')) || (data[local_24] == ']')) ||
     ((data[local_24] == '}' || (iVar2 = lyjson_isspace((int)data[local_24]), iVar2 != 0)))) {
    ctx_local._4_4_ = local_24;
  }
  else {
    ly_vlog(ctx,LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid character in JSON Number value (\'%c\')."
            ,(ulong)(uint)(int)data[local_24]);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static unsigned int
lyjson_parse_number(struct ly_ctx *ctx, const char *data)
{
    unsigned int len = 0;

    if (data[len] == '-') {
        ++len;
    }

    if (data[len] == '0') {
        ++len;
    } else if (isdigit(data[len])) {
        ++len;
        while (isdigit(data[len])) {
            ++len;
        }
    } else {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid character in JSON Number value ('%c').", data[len]);
        return 0;
    }

    if (data[len] == '.') {
        ++len;
        if (!isdigit(data[len])) {
            if (data[len]) {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid character in JSON Number value ('%c').", data[len]);
            } else {
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid character in JSON Number value (EOF).");
            }
            return 0;
        }
        while (isdigit(data[len])) {
            ++len;
        }
    }

    if ((data[len] == 'e') || (data[len] == 'E')) {
        ++len;
        if ((data[len] == '+') || (data[len] == '-')) {
            ++len;
        }
        while (isdigit(data[len])) {
            ++len;
        }
    }

    if (data[len] && (data[len] != ',') && (data[len] != ']') && (data[len] != '}') && !lyjson_isspace(data[len])) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid character in JSON Number value ('%c').", data[len]);
        return 0;
    }

    return len;
}